

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void proto2_unittest::OneBytes::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  OneBytes *this;
  MessageLite *value;
  OneBytes **v1;
  OneBytes **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  Arena *arena;
  uint32_t cached_has_bits;
  LogMessage local_68;
  Voidify local_51;
  OneBytes *local_50;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  OneBytes *from;
  OneBytes *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  OneBytes *local_18;
  anon_union_16_1_493b367e_for_OneBytes_3 *local_10;
  
  local_50 = (OneBytes *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (OneBytes *)to_msg;
  _this = (OneBytes *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<proto2_unittest::OneBytes_const*>
                 (&local_50);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<proto2_unittest::OneBytes*>(&from);
  local_48 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::OneBytes_const*,proto2_unittest::OneBytes*>
                       (v1,v2,"&from != _this");
  if (local_48 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_48);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest.pb.cc"
               ,0x7971,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_68);
  }
  puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
  this = from;
  uVar1 = *puVar3;
  if ((uVar1 & 1) != 0) {
    to_msg_local = (MessageLite *)
                   _internal_data_abi_cxx11_((OneBytes *)absl_log_internal_check_op_result);
    local_18 = this;
    local_10 = &this->field_0;
    puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(this->field_0)._impl_._has_bits_,0);
    value = to_msg_local;
    *puVar3 = *puVar3 | 1;
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    google::protobuf::internal::ArenaStringPtr::Set<>
              (&(this->field_0)._impl_.data_,(string *)value,arena);
  }
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void OneBytes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<OneBytes*>(&to_msg);
  auto& from = static_cast<const OneBytes&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.OneBytes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _this->_internal_set_data(from._internal_data());
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}